

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O3

size_t absl::lts_20240722::cord_internal::GetEstimatedMemoryUsage(Nonnull<const_CordRep_*> rep)

{
  byte bVar1;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1> raw_usage;
  RawUsage<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1> local_8;
  
  local_8.total = 0;
  bVar1 = rep->tag;
  if (bVar1 == 2) {
    local_8.total = 0x20;
    rep = (Nonnull<const_CordRep_*>)rep[1].length;
    if (rep == (Nonnull<const_CordRep_*>)0x0) {
      return 0x20;
    }
    bVar1 = rep->tag;
  }
  if (bVar1 < 5) {
    if (bVar1 == 3) {
      anon_unknown_0::
      AnalyzeBtree<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
                ((CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>)rep,
                 &local_8);
      return local_8.total;
    }
    if ((bVar1 != 1) || (*(byte *)(*(long *)&rep[1].refcount + 0xc) < 5)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0xae,
                    "size_t absl::cord_internal::(anonymous namespace)::GetEstimatedUsage(absl::Nonnull<const CordRep *>) [mode = absl::cord_internal::(anonymous namespace)::Mode::kTotal]"
                   );
    }
  }
  anon_unknown_0::AnalyzeDataEdge<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>
            ((CordRepRef<(absl::lts_20240722::cord_internal::(anonymous_namespace)::Mode)1>)rep,
             &local_8);
  return local_8.total;
}

Assistant:

size_t GetEstimatedMemoryUsage(absl::Nonnull<const CordRep*> rep) {
  return GetEstimatedUsage<Mode::kTotal>(rep);
}